

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location)

{
  bool bVar1;
  Type *this_00;
  string *psVar2;
  LocationRecorder location;
  string identifier;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                      (&(uninterpreted_option->name_).super_RepeatedPtrFieldBase);
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  identifier._M_string_length = 0;
  identifier.field_2._M_local_buf[0] = '\0';
  bVar1 = LookingAt(this,"(");
  if (bVar1) {
    bVar1 = Consume(this,"(");
    if (bVar1) {
      LocationRecorder::LocationRecorder(&location,part_location,1);
      if ((this->input_->current_).type == TYPE_IDENTIFIER) {
        bVar1 = ConsumeIdentifier(this,&identifier,"Expected identifier.");
        if (!bVar1) goto LAB_002193ef;
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_(this_00);
        std::__cxx11::string::append((string *)psVar2);
      }
      while( true ) {
        bVar1 = LookingAt(this,".");
        if (!bVar1) break;
        bVar1 = Consume(this,".");
        if (!bVar1) goto LAB_002193ef;
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_(this_00);
        std::__cxx11::string::append((char *)psVar2);
        bVar1 = ConsumeIdentifier(this,&identifier,"Expected identifier.");
        if (!bVar1) goto LAB_002193ef;
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_(this_00);
        std::__cxx11::string::append((string *)psVar2);
      }
      LocationRecorder::~LocationRecorder(&location);
      bVar1 = Consume(this,")");
      if (bVar1) {
        *(byte *)this_00->_has_bits_ = (byte)this_00->_has_bits_[0] | 2;
        this_00->is_extension_ = true;
        goto LAB_002193eb;
      }
    }
  }
  else {
    LocationRecorder::LocationRecorder(&location,part_location,1);
    bVar1 = ConsumeIdentifier(this,&identifier,"Expected identifier.");
    if (bVar1) {
      psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_(this_00);
      std::__cxx11::string::append((string *)psVar2);
      *(byte *)this_00->_has_bits_ = (byte)this_00->_has_bits_[0] | 2;
      this_00->is_extension_ = false;
      LocationRecorder::~LocationRecorder(&location);
LAB_002193eb:
      bVar1 = true;
      goto LAB_002193f9;
    }
LAB_002193ef:
    LocationRecorder::~LocationRecorder(&location);
  }
  bVar1 = false;
LAB_002193f9:
  std::__cxx11::string::~string((string *)&identifier);
  return bVar1;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {  // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}